

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_of(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  stringpiece_ssize_type length;
  size_type sVar5;
  char *data;
  bool lookup [256];
  char acStack_128 [256];
  
  lVar4 = s.length_;
  lVar1 = this->length_;
  if (0 < lVar4 && 0 < lVar1) {
    if (lVar4 == 1) {
      sVar5 = lVar1 - 1U;
      if (pos <= lVar1 - 1U) {
        sVar5 = pos;
      }
      if (-1 < (long)sVar5) {
        do {
          if (this->ptr_[sVar5] == *s.ptr_) {
            return sVar5;
          }
          bVar2 = 0 < (long)sVar5;
          sVar5 = sVar5 - 1;
        } while (bVar2);
      }
    }
    else {
      memset(acStack_128,0,0x100);
      if (0 < lVar4) {
        lVar3 = 0;
        do {
          acStack_128[(byte)s.ptr_[lVar3]] = '\x01';
          lVar3 = lVar3 + 1;
        } while (lVar4 != lVar3);
      }
      sVar5 = lVar1 - 1U;
      if (pos <= lVar1 - 1U) {
        sVar5 = pos;
      }
      if (-1 < (long)sVar5) {
        do {
          if (acStack_128[(byte)this->ptr_[sVar5]] != '\0') {
            return sVar5;
          }
          bVar2 = 0 < (long)sVar5;
          sVar5 = sVar5 - 1;
        } while (bVar2);
      }
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i =
       std::min(pos, static_cast<size_type>(length_ - 1)); i >= 0; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}